

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int moveToLeftmost(BtCursor *pCur)

{
  u8 uVar1;
  uint uVar2;
  MemPage *pMVar3;
  int iVar4;
  
  pMVar3 = pCur->pPage;
  uVar1 = pMVar3->leaf;
  while( true ) {
    if (uVar1 != '\0') {
      return 0;
    }
    uVar2 = *(uint *)(pMVar3->aData +
                     (CONCAT11(pMVar3->aCellIdx[(ulong)pCur->ix * 2],
                               pMVar3->aCellIdx[(ulong)pCur->ix * 2 + 1]) & pMVar3->maskPage));
    iVar4 = moveToChild(pCur,uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                             uVar2 << 0x18);
    if (iVar4 != 0) break;
    pMVar3 = pCur->pPage;
    uVar1 = pMVar3->leaf;
  }
  return iVar4;
}

Assistant:

static int moveToLeftmost(BtCursor *pCur){
  Pgno pgno;
  int rc = SQLITE_OK;
  MemPage *pPage;

  assert( cursorOwnsBtShared(pCur) );
  assert( pCur->eState==CURSOR_VALID );
  while( rc==SQLITE_OK && !(pPage = pCur->pPage)->leaf ){
    assert( pCur->ix<pPage->nCell );
    pgno = get4byte(findCell(pPage, pCur->ix));
    rc = moveToChild(pCur, pgno);
  }
  return rc;
}